

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::setUseColour(ConfigData *config,string *value)

{
  bool bVar1;
  runtime_error *this;
  long in_RDI;
  string mode;
  char *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  string *in_stack_ffffffffffffffc8;
  string local_30 [40];
  long local_8;
  
  local_8 = in_RDI;
  toLower(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffb7,
                                   CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                          in_stack_ffffffffffffffa8);
  if (bVar1) {
    *(undefined4 *)(local_8 + 0x24) = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            in_stack_ffffffffffffffa8);
    if (bVar1) {
      *(undefined4 *)(local_8 + 0x24) = 2;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                                      in_stack_ffffffffffffffb0)),
                              in_stack_ffffffffffffffa8);
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"colour mode must be one of: auto, yes or no");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(undefined4 *)(local_8 + 0x24) = 0;
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void setUseColour( ConfigData& config, std::string const& value ) {
        std::string mode = toLower( value );

        if( mode == "yes" )
            config.useColour = UseColour::Yes;
        else if( mode == "no" )
            config.useColour = UseColour::No;
        else if( mode == "auto" )
            config.useColour = UseColour::Auto;
        else
            throw std::runtime_error( "colour mode must be one of: auto, yes or no" );
    }